

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9_PATHSEP_Const(jx9_value *pVal,void *pUnused)

{
  void *pUnused_local;
  jx9_value *pVal_local;
  
  jx9_value_string(pVal,":",1);
  return;
}

Assistant:

static void JX9_PATHSEP_Const(jx9_value *pVal, void *pUnused)
{
	SXUNUSED(pUnused);
#ifdef __WINNT__
	jx9_value_string(pVal, ";", (int)sizeof(char));
#else
	jx9_value_string(pVal, ":", (int)sizeof(char));
#endif
}